

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool skipheader;
  bool bVar1;
  int iVar2;
  int seed;
  undefined8 extraout_RAX;
  bool bVar3;
  char *__end;
  int local_78;
  string local_70;
  string local_50;
  
  skipheader = false;
  bVar3 = false;
  bVar1 = false;
  local_78 = 0;
  seed = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar2 = getopt(argc,argv,"vhsrg:S:");
          if (iVar2 != 0x53) break;
          seed = atoi(_optarg);
        }
        if (0x71 < iVar2) break;
        if (iVar2 == -1) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
          initstreams(&local_50,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (bVar3) {
            doit(skipheader);
          }
          else if (bVar1) {
            genrandomnumbers(skipheader,local_78,seed);
          }
          return 0;
        }
        if (iVar2 != 0x67) goto LAB_00101721;
        local_78 = atoi(_optarg);
        bVar1 = true;
      }
      if (iVar2 != 0x72) break;
      bVar3 = true;
    }
    if (iVar2 != 0x73) break;
    skipheader = true;
  }
  if (iVar2 == 0x76) {
    main_cold_1();
  }
LAB_00101721:
  main_cold_2();
  if (local_70._M_dataplus._M_p != "vhsrg:S:") {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50._M_dataplus._M_p != (pointer)(ulong)(uint)argc) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char *argv[])
{
	bool skipheader = false;
	bool bintorand = false;
	bool generaterandno = false;
	int totalrandno = 0;
	int seedval = 0;
	int opt;
	while ((opt = getopt(argc, argv, "vhsrg:S:")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'r':
			bintorand = true;
			break;
		case 'g':
			generaterandno = true;
			totalrandno = atoi(optarg);
			break;
		case 'S':
			seedval = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			::exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}


	initstreams("", "");
	if (bintorand == true) {
		doit(skipheader);
		return EXIT_SUCCESS;
	}

	if (generaterandno == true) {
		genrandomnumbers(skipheader,totalrandno,seedval);
		return EXIT_SUCCESS;
	}
    
}